

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> parse(string *module)

{
  Module *pMVar1;
  Element *pEVar2;
  undefined8 *in_RSI;
  SExpressionWasmBuilder local_2d8 [8];
  SExpressionWasmBuilder builder;
  SExpressionParser local_78 [8];
  SExpressionParser parser;
  MixedArena local_58;
  uint local_28;
  
  pMVar1 = (Module *)operator_new(0x348);
  memset(pMVar1,0,0x348);
  wasm::Module::Module(pMVar1);
  (module->_M_dataplus)._M_p = (pointer)pMVar1;
  (pMVar1->features).features = 0x1efff;
  wasm::SExpressionParser::SExpressionParser(local_78,(char *)*in_RSI);
  pMVar1 = (Module *)(module->_M_dataplus)._M_p;
  pEVar2 = (Element *)wasm::Element::operator[](local_28);
  wasm::SExpressionWasmBuilder::SExpressionWasmBuilder(local_2d8,pMVar1,pEVar2,Normal);
  wasm::SExpressionWasmBuilder::~SExpressionWasmBuilder(local_2d8);
  MixedArena::~MixedArena(&local_58);
  return (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
         (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)module;
}

Assistant:

static std::unique_ptr<Module> parse(std::string module) {
  auto wasm = std::make_unique<Module>();
  wasm->features = FeatureSet::All;
  try {
    SExpressionParser parser(&module.front());
    Element& root = *parser.root;
    SExpressionWasmBuilder builder(*wasm, *root[0], IRProfile::Normal);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    Fatal() << "error in parsing wasm text";
  }
  return wasm;
}